

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::scanOutput(Parser *this,ScannedTopLevelItem *item)

{
  iterator __position;
  Module *pMVar1;
  SourceCodeText *o;
  bool bVar2;
  OutputDeclaration *pOVar3;
  Identifier name;
  int line;
  char *location;
  char *message;
  Identifier *in_R9;
  CodeLocation errorLocation;
  CodeLocation local_68;
  pool_ref<soul::heart::OutputDeclaration> local_58;
  CompileMessage local_50;
  
  local_68.sourceCode.object =
       (SourceCodeText *)
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  __position._M_current =
       (item->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (item->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::
    _M_realloc_insert<soul::UTF8Reader>(&item->outputDecls,__position,(UTF8Reader *)&local_68);
  }
  else {
    (__position._M_current)->data = (char *)local_68.sourceCode.object;
    (item->outputDecls).super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  pMVar1 = (this->module).object;
  if (pMVar1 == (Module *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  pOVar3 = PoolAllocator::allocate<soul::heart::OutputDeclaration,soul::CodeLocation&>
                     (&pMVar1->allocator->pool,
                      &(this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ).location);
  name = parseGeneralIdentifier(this);
  (pOVar3->super_IODeclaration).name.name = name.name;
  o = (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_68.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  local_68.sourceCode.object = o;
  if (name.name == (string *)0x0) {
    line = 0x21;
    location = "operator const std::basic_string<char> &";
    message = "isValid()";
  }
  else {
    bVar2 = isReservedFunctionName(name.name);
    if (bVar2) {
      CompileMessageHelpers::createMessage<soul::Identifier&>
                (&local_50,(CompileMessageHelpers *)0x1,none,0x2ad7c0,
                 (char *)&(pOVar3->super_IODeclaration).name,in_R9);
      CodeLocation::throwError(&local_68,&local_50);
    }
    pMVar1 = (this->module).object;
    if (pMVar1 != (Module *)0x0) {
      local_58.object = pOVar3;
      std::
      vector<soul::pool_ref<soul::heart::OutputDeclaration>,std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>>>
      ::emplace_back<soul::pool_ref<soul::heart::OutputDeclaration>>
                ((vector<soul::pool_ref<soul::heart::OutputDeclaration>,std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>>>
                  *)&pMVar1->outputs,&local_58);
      skipPastNextOccurrenceOf(this,(TokenType)0x2881d4);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
      return;
    }
    line = 0x3c;
    location = "operator->";
    message = "object != nullptr";
  }
  throwInternalCompilerError(message,location,line);
}

Assistant:

void scanOutput (ScannedTopLevelItem& item)
    {
        item.outputDecls.push_back (getCurrentTokeniserPosition());
        auto& outputDeclaration = module->allocate<heart::OutputDeclaration> (location);
        outputDeclaration.name = parseGeneralIdentifier();

        auto errorLocation = location;
        if (isReservedFunctionName (outputDeclaration.name))
            errorLocation.throwError (Errors::invalidEndpointName (outputDeclaration.name));

        module->outputs.push_back (outputDeclaration);
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }